

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O1

void Gia_ObjAddFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  int iVar8;
  int iVar10;
  int iVar11;
  uint *puVar12;
  long lVar13;
  int iVar9;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0x77,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((((ulong)pObj & 1) != 0) || (((ulong)pFanout & 1) != 0)) {
    __assert_fail("!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0x78,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pFanout) && (pFanout < pGVar3 + p->nObjs)) {
    iVar9 = (int)((ulong)((long)pFanout - (long)pGVar3) >> 2);
    iVar8 = iVar9 * -0x55555555;
    if (iVar8 < 1) {
      __assert_fail("Gia_ObjId(p, pFanout) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                    ,0x79,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
      iVar10 = (int)((ulong)((long)pObj - (long)pGVar3) >> 2);
      iVar4 = iVar10 * -0x55555555;
      iVar11 = p->nFansAlloc;
      if ((iVar11 == iVar4 || SBORROW4(iVar11,iVar4) != iVar11 + iVar10 * 0x55555555 < 0) ||
          (iVar11 == iVar8 || SBORROW4(iVar11,iVar8) != iVar11 + iVar9 * 0x55555555 < 0)) {
        if (iVar4 != iVar8 && SBORROW4(iVar4,iVar8) == iVar4 + iVar9 * 0x55555555 < 0) {
          iVar8 = iVar4;
        }
        piVar6 = (int *)realloc(p->pFanData,(ulong)(uint)(iVar8 * 10) << 2);
        p->pFanData = piVar6;
        memset(piVar6 + (long)p->nFansAlloc * 5,0,((long)iVar8 * 2 - (long)p->nFansAlloc) * 0x14);
        p->nFansAlloc = (int)((long)iVar8 * 2);
      }
      pGVar3 = p->pObjs;
      if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
        iVar9 = (int)((ulong)((long)pObj - (long)pGVar3) >> 2);
        iVar11 = iVar9 * -0x55555555;
        iVar8 = p->nFansAlloc;
        if (iVar8 == iVar11 || SBORROW4(iVar8,iVar11) != iVar8 + iVar9 * 0x55555555 < 0) {
LAB_00207511:
          __assert_fail("Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                        ,0x81,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        if ((pGVar3 <= pFanout) && (pFanout < pGVar3 + p->nObjs)) {
          iVar9 = (int)((ulong)((long)pFanout - (long)pGVar3) >> 2);
          if (iVar8 == iVar9 * -0x55555555 ||
              SBORROW4(iVar8,iVar9 * -0x55555555) != iVar8 + iVar9 * 0x55555555 < 0)
          goto LAB_00207511;
          uVar5 = Gia_ObjWhatFanin(p,pFanout,pObj);
          if (1 < uVar5) {
            __assert_fail("Num < 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                          ,0x24,"int Gia_FanoutCreate(int, int)");
          }
          pGVar3 = p->pObjs;
          if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
            uVar1 = uVar5 + iVar9 * 0x55555556;
            piVar6 = p->pFanData;
            iVar8 = iVar9 * 0x55555556 >> 1;
            puVar12 = (uint *)(piVar6 + (long)(iVar8 * 5) + (ulong)uVar5 + 1);
            puVar7 = (uint *)(piVar6 + (long)(iVar8 * 5) + (ulong)uVar5 + 3);
            lVar13 = (long)(((ulong)((long)pObj - (long)pGVar3) >> 2) * 0x5555555700000000) >> 0x1e;
            uVar5 = *(uint *)((long)piVar6 + lVar13);
            if (uVar5 == 0) {
              *(uint *)((long)piVar6 + lVar13) = uVar1;
            }
            else {
              uVar2 = piVar6[(long)(((int)uVar5 >> 1) * 5) + (ulong)(uVar5 & 1) + 1];
              if (piVar6[(long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3] != uVar5) {
                __assert_fail("*pNext == *pFirst",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                              ,0x90,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
              }
              *puVar12 = uVar2;
              puVar12 = (uint *)(piVar6 + (long)(((int)uVar5 >> 1) * 5) + (ulong)(uVar5 & 1) + 1);
              *puVar7 = *(uint *)((long)piVar6 + lVar13);
              puVar7 = (uint *)(piVar6 + (long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3);
            }
            *puVar12 = uVar1;
            *puVar7 = uVar1;
            return;
          }
        }
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjAddFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    if ( Gia_ObjId(p, pObj) >= p->nFansAlloc || Gia_ObjId(p, pFanout) >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( Gia_ObjId(p, pObj), Gia_ObjId(p, pFanout) ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Gia_FanoutPrev( p->pFanData, *pFirst );
        pNext = Gia_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}